

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundConfig.cpp
# Opt level: O2

void __thiscall
SoundConfig::readSettings(SoundConfig *this,QSettings *settings,AudioEnumerator *enumerator)

{
  int iVar1;
  qsizetype qVar2;
  QDebug *pQVar3;
  QVariant deviceId;
  QString api;
  anon_union_24_3_e3d07ef4_for_data local_a8;
  char *local_90;
  QVariant local_80;
  anon_union_24_3_e3d07ef4_for_data local_60;
  char *local_48;
  QArrayDataPointer<char16_t> local_40;
  
  QSettings::beginGroup((QString *)settings);
  local_a8._0_4_ = 0;
  local_a8._4_4_ = 0;
  local_a8._8_4_ = 0;
  local_a8._12_4_ = 0;
  local_a8._16_4_ = 0;
  local_a8._20_4_ = 0;
  local_90 = (char *)0x2;
  QSettings::value((QString *)local_60.data,(QVariant *)settings);
  QVariant::toString();
  QVariant::~QVariant((QVariant *)&local_60);
  QVariant::~QVariant((QVariant *)&local_a8);
  if (local_40.size == 0) {
LAB_00141235:
    iVar1 = 0;
LAB_00141238:
    this->mBackendIndex = iVar1;
  }
  else {
    AudioEnumerator::backendNames((QStringList *)&local_60,enumerator);
    qVar2 = QListSpecialMethods<QString>::indexOf
                      ((QListSpecialMethods<QString> *)local_60.data,(QString *)&local_40,0);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_60);
    iVar1 = (int)qVar2;
    if (iVar1 == -1) {
      local_60._0_4_ = 2;
      local_60._20_4_ = 0;
      local_60._4_8_ = 0;
      local_60._12_8_ = 0;
      local_48 = "default";
      QMessageLogger::warning();
      *(undefined1 *)(CONCAT44(local_a8._4_4_,local_a8._0_4_) + 0x31) = 1;
      pQVar3 = QDebug::operator<<((QDebug *)&local_a8.shared,"[SoundConfig]");
      pQVar3 = QDebug::operator<<(pQVar3,"audio API");
      pQVar3 = QDebug::operator<<(pQVar3,(QString *)&local_40);
      QDebug::operator<<(pQVar3,"not available");
      QDebug::~QDebug((QDebug *)&local_a8.shared);
      goto LAB_00141235;
    }
    if (-2 < iVar1) goto LAB_00141238;
  }
  AudioEnumerator::populate(enumerator,iVar1);
  local_a8._0_4_ = 0;
  local_a8._4_4_ = 0;
  local_a8._8_4_ = 0;
  local_a8._12_4_ = 0;
  local_a8._16_4_ = 0;
  local_a8._20_4_ = 0;
  local_90 = (char *)0x2;
  QSettings::value((QString *)local_60.data,(QVariant *)settings);
  QVariant::~QVariant((QVariant *)&local_a8);
  iVar1 = AudioEnumerator::deserializeDevice(enumerator,iVar1,(QVariant *)&local_60);
  if (iVar1 == -1) {
    local_a8._0_4_ = 2;
    local_a8._20_4_ = 0;
    local_a8._4_4_ = 0;
    local_a8._8_4_ = 0;
    local_a8._12_4_ = 0;
    local_a8._16_4_ = 0;
    local_90 = "default";
    QMessageLogger::warning();
    pQVar3 = QDebug::operator<<((QDebug *)&local_80,"[SoundConfig]");
    QDebug::operator<<(pQVar3,"last configured device not available, using default");
    QDebug::~QDebug((QDebug *)&local_80);
    iVar1 = 0;
  }
  else if (iVar1 < -1) goto LAB_001412ea;
  this->mDeviceIndex = iVar1;
LAB_001412ea:
  iVar1 = samplerate(this);
  QVariant::QVariant(&local_80,iVar1);
  QSettings::value((QString *)local_a8.data,(QVariant *)settings);
  iVar1 = QVariant::toInt((bool *)local_a8.data);
  setSamplerate(this,iVar1);
  QVariant::~QVariant((QVariant *)&local_a8);
  QVariant::~QVariant(&local_80);
  QVariant::QVariant(&local_80,this->mLatency);
  QSettings::value((QString *)local_a8.data,(QVariant *)settings);
  iVar1 = QVariant::toInt((bool *)local_a8.data);
  setLatency(this,iVar1);
  QVariant::~QVariant((QVariant *)&local_a8);
  QVariant::~QVariant(&local_80);
  QVariant::QVariant(&local_80,this->mPeriod);
  QSettings::value((QString *)local_a8.data,(QVariant *)settings);
  iVar1 = QVariant::toInt((bool *)local_a8.data);
  setPeriod(this,iVar1);
  QVariant::~QVariant((QVariant *)&local_a8);
  QVariant::~QVariant(&local_80);
  QSettings::endGroup();
  QVariant::~QVariant((QVariant *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  return;
}

Assistant:

void SoundConfig::readSettings(QSettings &settings, AudioEnumerator &enumerator) {
    settings.beginGroup(Keys::Sound);

    //
    // Sound configuration notes:
    // If the API cannot be found the first one available is chosen
    // If the device name cannot be found, the default one is chosen
    //

    QString api = settings.value(Keys::api).toString();
    int backend;
    if (api.isEmpty()) {
        backend = 0; // default to first available
    } else {
        backend = enumerator.backendNames().indexOf(api);
        if (backend == -1) {
            qWarning().noquote() << TU::LOG_PREFIX << "audio API" << api << "not available";
            backend = 0; // default to the first one
        }
    }

    setBackendIndex(backend);
    enumerator.populate(backend);

    auto deviceId = settings.value(Keys::deviceId);
    int device = enumerator.deserializeDevice(backend, deviceId);
    if (device == -1) {
        qWarning() << TU::LOG_PREFIX << "last configured device not available, using default";
        device = 0;
    }
    setDeviceIndex(device);

    setSamplerate(settings.value(Keys::samplerate, samplerate()).toInt());
    setLatency(settings.value(Keys::latency, mLatency).toInt());
    setPeriod(settings.value(Keys::period, mPeriod).toInt());

    settings.endGroup();
}